

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O1

sds duckdb_hll::sdstrim(sds s,char *cset)

{
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *__src;
  
  switch(s[-1] & 7) {
  case 0:
    uVar1 = (ulong)((byte)s[-1] >> 3);
    break;
  case 1:
    uVar1 = (ulong)(byte)s[-4];
    break;
  case 2:
    uVar1 = (ulong)*(ushort *)(s + -6);
    break;
  case 3:
    uVar1 = (ulong)*(uint *)(s + -10);
    break;
  case 4:
    uVar1 = *(ulong *)(s + -0x12);
    break;
  default:
    uVar1 = 0;
  }
  pcVar3 = s + (uVar1 - 1);
  __src = s;
  pcVar4 = pcVar3;
  if (s <= pcVar3) {
    do {
      pcVar2 = strchr(cset,(int)*__src);
      if (pcVar2 == (char *)0x0) break;
      __src = __src + 1;
    } while (__src <= pcVar3);
  }
  while ((__src < pcVar3 &&
         (pcVar2 = strchr(cset,(int)*pcVar3), pcVar4 = pcVar3, pcVar2 != (char *)0x0))) {
    pcVar3 = pcVar3 + -1;
    pcVar4 = __src;
  }
  pcVar3 = (char *)0x0;
  if (__src <= pcVar4) {
    pcVar3 = pcVar4 + (1 - (long)__src);
  }
  if (__src != s) {
    memmove(s,__src,(size_t)pcVar3);
  }
  s[(long)pcVar3] = '\0';
  switch(s[-1] & 7) {
  case 0:
    s[-1] = (char)pcVar3 << 3;
    break;
  case 1:
    s[-4] = (char)pcVar3;
    break;
  case 2:
    *(short *)(s + -6) = (short)pcVar3;
    break;
  case 3:
    *(int *)(s + -10) = (int)pcVar3;
    break;
  case 4:
    *(char **)(s + -0x12) = pcVar3;
  }
  return s;
}

Assistant:

sds sdstrim(sds s, const char *cset) {
    char *start, *end, *sp, *ep;
    size_t len;

    sp = start = s;
    ep = end = s+sdslen(s)-1;
    while(sp <= end && strchr(cset, *sp)) sp++;
    while(ep > sp && strchr(cset, *ep)) ep--;
    len = (sp > ep) ? 0 : ((ep-sp)+1);
    if (s != sp) memmove(s, sp, len);
    s[len] = '\0';
    sdssetlen(s,len);
    return s;
}